

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestScriptHandler.cxx
# Opt level: O2

void __thiscall cmCTestScriptHandler::CreateCMake(cmCTestScriptHandler *this)

{
  int recursionDepth;
  cmake *pcVar1;
  cmGlobalGenerator *this_00;
  cmMakefile *pcVar2;
  cmCTestBuildCommand *this_01;
  cmCTestCommand *pcVar3;
  cmCTestCoverageCommand *this_02;
  cmCTestStartCommand *this_03;
  cmCTestSubmitCommand *this_04;
  cmCTestUploadCommand *this_05;
  bool collapse;
  allocator<char> local_99;
  undefined1 local_98 [48];
  string cwd;
  cmStateSnapshot snapshot;
  _Any_data local_30;
  code *local_20;
  code *local_18;
  
  pcVar1 = this->CMake;
  if (pcVar1 != (cmake *)0x0) {
    cmake::~cmake(pcVar1);
    operator_delete(pcVar1,0x388);
    if (this->GlobalGenerator != (cmGlobalGenerator *)0x0) {
      (*this->GlobalGenerator->_vptr_cmGlobalGenerator[1])();
    }
    pcVar2 = this->Makefile;
    if (pcVar2 != (cmMakefile *)0x0) {
      cmMakefile::~cmMakefile(pcVar2);
    }
    operator_delete(pcVar2,0x7e8);
  }
  pcVar1 = (cmake *)operator_new(0x388);
  cmake::cmake(pcVar1,RoleScript,CTest);
  this->CMake = pcVar1;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_98,"",(allocator<char> *)&cwd);
  cmake::SetHomeDirectory(pcVar1,(string *)local_98);
  std::__cxx11::string::~string((string *)local_98);
  pcVar1 = this->CMake;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_98,"",(allocator<char> *)&cwd);
  cmake::SetHomeOutputDirectory(pcVar1,(string *)local_98);
  std::__cxx11::string::~string((string *)local_98);
  pcVar1 = this->CMake;
  local_98._16_8_ = (pcVar1->CurrentSnapshot).Position.Position;
  local_98._0_8_ = (pcVar1->CurrentSnapshot).State;
  local_98._8_8_ = (pcVar1->CurrentSnapshot).Position.Tree;
  cmStateSnapshot::SetDefaultDefinitions((cmStateSnapshot *)local_98);
  cmake::AddCMakePaths(this->CMake);
  this_00 = (cmGlobalGenerator *)operator_new(0x608);
  cmGlobalGenerator::cmGlobalGenerator(this_00,this->CMake);
  this->GlobalGenerator = this_00;
  pcVar1 = this->CMake;
  snapshot.Position.Position = (pcVar1->CurrentSnapshot).Position.Position;
  snapshot.State = (pcVar1->CurrentSnapshot).State;
  snapshot.Position.Tree = (pcVar1->CurrentSnapshot).Position.Tree;
  cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_(&cwd,(SystemTools *)0x1,collapse);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)local_98,&snapshot);
  cmStateDirectory::SetCurrentSource((cmStateDirectory *)local_98,&cwd);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)local_98,&snapshot);
  cmStateDirectory::SetCurrentBinary((cmStateDirectory *)local_98,&cwd);
  pcVar2 = (cmMakefile *)operator_new(0x7e8);
  cmMakefile::cmMakefile(pcVar2,this->GlobalGenerator,&snapshot);
  this->Makefile = pcVar2;
  if (this->ParentMakefile != (cmMakefile *)0x0) {
    recursionDepth = cmMakefile::GetRecursionDepth(this->ParentMakefile);
    cmMakefile::SetRecursionDepth(pcVar2,recursionDepth);
  }
  local_30._8_8_ = 0;
  local_18 = std::
             _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_float),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestScriptHandler.cxx:292:5)>
             ::_M_invoke;
  local_20 = std::
             _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_float),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestScriptHandler.cxx:292:5)>
             ::_M_manager;
  local_30._M_unused._M_object = this;
  cmake::SetProgressCallback(this->CMake,(ProgressCallbackType *)&local_30);
  std::_Function_base::~_Function_base((_Function_base *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_98,"ctest_build",&local_99);
  this_01 = (cmCTestBuildCommand *)operator_new(0xb8);
  cmCTestBuildCommand::cmCTestBuildCommand(this_01);
  AddCTestCommand(this,(string *)local_98,(cmCTestCommand *)this_01);
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_98,"ctest_configure",&local_99)
  ;
  pcVar3 = (cmCTestCommand *)operator_new(0xa8);
  cmCTestConfigureCommand::cmCTestConfigureCommand((cmCTestConfigureCommand *)pcVar3);
  AddCTestCommand(this,(string *)local_98,pcVar3);
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_98,"ctest_coverage",&local_99);
  this_02 = (cmCTestCoverageCommand *)operator_new(0xe0);
  cmCTestCoverageCommand::cmCTestCoverageCommand(this_02);
  AddCTestCommand(this,(string *)local_98,(cmCTestCommand *)this_02);
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_98,"ctest_empty_binary_directory",&local_99);
  pcVar3 = (cmCTestCommand *)operator_new(0x40);
  (pcVar3->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (pcVar3->super_cmCommand).Error._M_dataplus._M_p =
       (pointer)&(pcVar3->super_cmCommand).Error.field_2;
  (pcVar3->super_cmCommand).Error._M_string_length = 0;
  (pcVar3->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  pcVar3->CTest = (cmCTest *)0x0;
  pcVar3->CTestScriptHandler = (cmCTestScriptHandler *)0x0;
  (pcVar3->super_cmCommand)._vptr_cmCommand = (_func_int **)&PTR__cmCommand_0063b7d0;
  AddCTestCommand(this,(string *)local_98,pcVar3);
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_98,"ctest_memcheck",&local_99);
  pcVar3 = (cmCTestCommand *)operator_new(0xa8);
  cmCTestMemCheckCommand::cmCTestMemCheckCommand((cmCTestMemCheckCommand *)pcVar3);
  AddCTestCommand(this,(string *)local_98,pcVar3);
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_98,"ctest_read_custom_files",&local_99);
  pcVar3 = (cmCTestCommand *)operator_new(0x40);
  (pcVar3->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (pcVar3->super_cmCommand).Error._M_dataplus._M_p =
       (pointer)&(pcVar3->super_cmCommand).Error.field_2;
  (pcVar3->super_cmCommand).Error._M_string_length = 0;
  (pcVar3->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  pcVar3->CTest = (cmCTest *)0x0;
  pcVar3->CTestScriptHandler = (cmCTestScriptHandler *)0x0;
  (pcVar3->super_cmCommand)._vptr_cmCommand = (_func_int **)&PTR__cmCommand_0063b980;
  AddCTestCommand(this,(string *)local_98,pcVar3);
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_98,"ctest_run_script",&local_99);
  pcVar3 = (cmCTestCommand *)operator_new(0x40);
  (pcVar3->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (pcVar3->super_cmCommand).Error._M_dataplus._M_p =
       (pointer)&(pcVar3->super_cmCommand).Error.field_2;
  (pcVar3->super_cmCommand).Error._M_string_length = 0;
  (pcVar3->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  pcVar3->CTest = (cmCTest *)0x0;
  pcVar3->CTestScriptHandler = (cmCTestScriptHandler *)0x0;
  (pcVar3->super_cmCommand)._vptr_cmCommand = (_func_int **)&PTR__cmCommand_0063b9e0;
  AddCTestCommand(this,(string *)local_98,pcVar3);
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_98,"ctest_sleep",&local_99);
  pcVar3 = (cmCTestCommand *)operator_new(0x40);
  (pcVar3->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (pcVar3->super_cmCommand).Error._M_dataplus._M_p =
       (pointer)&(pcVar3->super_cmCommand).Error.field_2;
  (pcVar3->super_cmCommand).Error._M_string_length = 0;
  (pcVar3->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  pcVar3->CTest = (cmCTest *)0x0;
  pcVar3->CTestScriptHandler = (cmCTestScriptHandler *)0x0;
  (pcVar3->super_cmCommand)._vptr_cmCommand = (_func_int **)&PTR__cmCommand_0063a1f0;
  AddCTestCommand(this,(string *)local_98,pcVar3);
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_98,"ctest_start",&local_99);
  this_03 = (cmCTestStartCommand *)operator_new(0x48);
  cmCTestStartCommand::cmCTestStartCommand(this_03);
  AddCTestCommand(this,(string *)local_98,(cmCTestCommand *)this_03);
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_98,"ctest_submit",&local_99);
  this_04 = (cmCTestSubmitCommand *)operator_new(0x1d8);
  cmCTestSubmitCommand::cmCTestSubmitCommand(this_04);
  AddCTestCommand(this,(string *)local_98,(cmCTestCommand *)this_04);
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_98,"ctest_test",&local_99);
  pcVar3 = (cmCTestCommand *)operator_new(0xa8);
  cmCTestTestCommand::cmCTestTestCommand((cmCTestTestCommand *)pcVar3);
  AddCTestCommand(this,(string *)local_98,pcVar3);
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_98,"ctest_update",&local_99);
  pcVar3 = (cmCTestCommand *)operator_new(0xa8);
  cmCTestUpdateCommand::cmCTestUpdateCommand((cmCTestUpdateCommand *)pcVar3);
  AddCTestCommand(this,(string *)local_98,pcVar3);
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_98,"ctest_upload",&local_99);
  this_05 = (cmCTestUploadCommand *)operator_new(0xd8);
  cmCTestUploadCommand::cmCTestUploadCommand(this_05);
  AddCTestCommand(this,(string *)local_98,(cmCTestCommand *)this_05);
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::~string((string *)&cwd);
  return;
}

Assistant:

void cmCTestScriptHandler::CreateCMake()
{
  // create a cmake instance to read the configuration script
  if (this->CMake) {
    delete this->CMake;
    delete this->GlobalGenerator;
    delete this->Makefile;
  }
  this->CMake = new cmake(cmake::RoleScript, cmState::CTest);
  this->CMake->SetHomeDirectory("");
  this->CMake->SetHomeOutputDirectory("");
  this->CMake->GetCurrentSnapshot().SetDefaultDefinitions();
  this->CMake->AddCMakePaths();
  this->GlobalGenerator = new cmGlobalGenerator(this->CMake);

  cmStateSnapshot snapshot = this->CMake->GetCurrentSnapshot();
  std::string cwd = cmSystemTools::GetCurrentWorkingDirectory();
  snapshot.GetDirectory().SetCurrentSource(cwd);
  snapshot.GetDirectory().SetCurrentBinary(cwd);
  this->Makefile = new cmMakefile(this->GlobalGenerator, snapshot);
  if (this->ParentMakefile) {
    this->Makefile->SetRecursionDepth(
      this->ParentMakefile->GetRecursionDepth());
  }

  this->CMake->SetProgressCallback(
    [this](const std::string& m, float /*unused*/) {
      if (!m.empty()) {
        cmCTestLog(this->CTest, HANDLER_OUTPUT, "-- " << m << std::endl);
      }
    });

  this->AddCTestCommand("ctest_build", new cmCTestBuildCommand);
  this->AddCTestCommand("ctest_configure", new cmCTestConfigureCommand);
  this->AddCTestCommand("ctest_coverage", new cmCTestCoverageCommand);
  this->AddCTestCommand("ctest_empty_binary_directory",
                        new cmCTestEmptyBinaryDirectoryCommand);
  this->AddCTestCommand("ctest_memcheck", new cmCTestMemCheckCommand);
  this->AddCTestCommand("ctest_read_custom_files",
                        new cmCTestReadCustomFilesCommand);
  this->AddCTestCommand("ctest_run_script", new cmCTestRunScriptCommand);
  this->AddCTestCommand("ctest_sleep", new cmCTestSleepCommand);
  this->AddCTestCommand("ctest_start", new cmCTestStartCommand);
  this->AddCTestCommand("ctest_submit", new cmCTestSubmitCommand);
  this->AddCTestCommand("ctest_test", new cmCTestTestCommand);
  this->AddCTestCommand("ctest_update", new cmCTestUpdateCommand);
  this->AddCTestCommand("ctest_upload", new cmCTestUploadCommand);
}